

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O1

void __thiscall doublechecked::Roaring::Roaring(Roaring *this,Roaring *r)

{
  _Rb_tree_header *p_Var1;
  
  (this->plain).roaring.high_low_container.keys = (uint16_t *)0x0;
  (this->plain).roaring.high_low_container.typecodes = (uint8_t *)0x0;
  (this->plain).roaring.high_low_container.size = 0;
  (this->plain).roaring.high_low_container.allocation_size = 0;
  (this->plain).roaring.high_low_container.containers = (container_s **)0x0;
  *(undefined8 *)&(this->plain).roaring.high_low_container.flags = 0;
  roaring_bitmap_init_with_capacity((roaring_bitmap_t *)this,0);
  p_Var1 = &(this->check)._M_t._M_impl.super__Rb_tree_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->check)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roaring::Roaring::operator=(&this->plain,&r->plain);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
            (&this->check,&r->check);
  return;
}

Assistant:

Roaring(Roaring &&r) noexcept {
        plain = std::move(r.plain);
        check = std::move(r.check);
    }